

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O0

void __thiscall
asl::Array<asl::Map<asl::String,_int>::KeyVal>::free
          (Array<asl::Map<asl::String,_int>::KeyVal> *this,void *__ptr)

{
  KeyVal *this_00;
  Data *pDVar1;
  int n;
  Array<asl::Map<asl::String,_int>::KeyVal> *this_local;
  
  this_00 = this->_a;
  pDVar1 = d(this);
  asl_destroy<asl::Map<asl::String,int>::KeyVal>((asl *)this_00,(KeyVal *)(ulong)(uint)pDVar1->n,n);
  ::free((void *)((long)&this->_a[-1].key.field_2 + 8));
  this->_a = (KeyVal *)0x0;
  return;
}

Assistant:

void Array<T>::free()
{
	asl_destroy(_a, d().n);
	ASL_RC_FREE();
	::free( (char*)_a - sizeof(Data) );
	_a=0;
}